

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4.h
# Opt level: O1

void ncnn::im2col_sgemm_pack8to4_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  uint _h;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int *piVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  float *pfVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  _func_int ***ppp_Var21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  uint uVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  undefined1 (*pauVar31) [32];
  undefined1 (*pauVar32) [32];
  int iVar33;
  undefined1 (*pauVar34) [32];
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  int nn;
  float zeros [8];
  Mat local_c8;
  ulong local_80;
  int local_78;
  int local_74;
  void *local_70;
  Mat *local_68;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar3 = bottom_im2col->w;
  lVar19 = (long)(int)uVar3;
  iVar4 = bottom_im2col->h;
  _h = bottom_im2col->c;
  uVar24 = (ulong)_h;
  local_80 = (ulong)top_blob->c;
  local_70 = _bias->data;
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elempack = 0;
  local_c8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  if (lVar19 < 8) {
    iVar33 = iVar4;
    uVar16 = uVar3;
    if (3 < (int)uVar3) {
      iVar33 = iVar4 * 4;
      uVar16 = (uVar3 & 3) + 1;
    }
  }
  else {
    iVar33 = iVar4 * 8;
    uVar16 = (uVar3 & 3) + (uVar3 >> 3) + (uint)((uVar3 >> 2 & 1) != 0);
  }
  local_c8.elemsize._4_4_ = (int)local_c8.refcount;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.c = local_c8.elempack;
  local_68 = top_blob;
  Mat::create(&local_c8,iVar33,_h,uVar16,0x20,8,opt->workspace_allocator);
  uVar16 = uVar3 + 7;
  if (-1 < (int)uVar3) {
    uVar16 = uVar3;
  }
  uVar16 = (int)uVar16 >> 3;
  if (7 < (int)uVar3) {
    lVar20 = 0x80;
    uVar23 = 0;
    do {
      if (0 < (int)_h) {
        ppp_Var21 = (_func_int ***)
                    ((long)(_func_int ***)local_c8.data +
                    local_c8.cstep * uVar23 *
                    CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        uVar28 = 0;
        do {
          if (0 < iVar4) {
            pauVar31 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar28 + lVar20);
            iVar33 = iVar4;
            do {
              auVar41 = vunpcklps_avx(pauVar31[-4],pauVar31[-3]);
              auVar68 = vunpckhps_avx(pauVar31[-4],pauVar31[-3]);
              auVar55 = vunpcklps_avx(pauVar31[-2],pauVar31[-1]);
              auVar46 = vunpckhps_avx(pauVar31[-2],pauVar31[-1]);
              auVar47 = vunpcklps_avx(*pauVar31,pauVar31[1]);
              auVar64 = vunpckhps_avx(*pauVar31,pauVar31[1]);
              auVar63 = vunpcklps_avx(pauVar31[2],pauVar31[3]);
              auVar66 = vunpckhps_avx(pauVar31[2],pauVar31[3]);
              auVar58 = vunpcklpd_avx(auVar41,auVar55);
              auVar41 = vunpckhpd_avx(auVar41,auVar55);
              auVar55 = vunpcklpd_avx(auVar68,auVar46);
              auVar68 = vunpckhpd_avx(auVar68,auVar46);
              auVar59 = vunpcklpd_avx(auVar47,auVar63);
              auVar46 = vunpckhpd_avx(auVar47,auVar63);
              auVar47 = vunpcklpd_avx(auVar64,auVar66);
              auVar64 = vunpckhpd_avx(auVar64,auVar66);
              auVar63._16_16_ = auVar59._0_16_;
              auVar63._0_16_ = auVar58._0_16_;
              auVar69._16_16_ = auVar46._0_16_;
              auVar69._0_16_ = auVar41._0_16_;
              auVar74._16_16_ = auVar47._0_16_;
              auVar74._0_16_ = auVar55._0_16_;
              auVar75._16_16_ = auVar64._0_16_;
              auVar75._0_16_ = auVar68._0_16_;
              auVar66 = vperm2f128_avx(auVar58,auVar59,0x31);
              auVar41 = vperm2f128_avx(auVar41,auVar46,0x31);
              auVar46 = vperm2f128_avx(auVar55,auVar47,0x31);
              auVar68 = vperm2f128_avx(auVar68,auVar64,0x31);
              *(undefined1 (*) [32])ppp_Var21 = auVar63;
              *(undefined1 (*) [32])(ppp_Var21 + 4) = auVar69;
              *(undefined1 (*) [32])(ppp_Var21 + 8) = auVar74;
              *(undefined1 (*) [32])(ppp_Var21 + 0xc) = auVar75;
              *(undefined1 (*) [32])(ppp_Var21 + 0x10) = auVar66;
              *(undefined1 (*) [32])(ppp_Var21 + 0x14) = auVar41;
              *(undefined1 (*) [32])(ppp_Var21 + 0x18) = auVar46;
              *(undefined1 (*) [32])(ppp_Var21 + 0x1c) = auVar68;
              ppp_Var21 = ppp_Var21 + 0x20;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + (ulong)(uVar3 * 8) * 4);
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar24);
      }
      uVar23 = uVar23 + 1;
      lVar20 = lVar20 + 0x100;
    } while (uVar23 != uVar16);
  }
  iVar33 = uVar16 * 8;
  uVar16 = uVar3 + uVar16 * -8;
  uVar22 = (int)uVar16 >> 2;
  if (0 < (int)uVar22) {
    lVar20 = (long)iVar33 * 0x20 + 0x60;
    uVar23 = 0;
    do {
      if (0 < (int)_h) {
        uVar27 = iVar33 + (int)uVar23 * 4;
        uVar30 = iVar33 + (int)uVar23 * 4 + 7;
        if (-1 < (int)uVar27) {
          uVar30 = uVar27;
        }
        ppp_Var21 = (_func_int ***)
                    ((long)(_func_int ***)local_c8.data +
                    (long)(((int)uVar30 >> 3) + ((int)(uVar27 - (uVar30 & 0xfffffff8)) >> 2)) *
                    local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                    );
        uVar28 = 0;
        do {
          if (0 < iVar4) {
            pauVar31 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar28 + lVar20);
            iVar36 = iVar4;
            do {
              auVar41 = vunpcklps_avx(pauVar31[-3],pauVar31[-2]);
              auVar68 = vunpckhps_avx(pauVar31[-3],pauVar31[-2]);
              auVar66 = vunpcklps_avx(pauVar31[-1],*pauVar31);
              auVar46 = vunpckhps_avx(pauVar31[-1],*pauVar31);
              auVar64 = vunpcklpd_avx(auVar41,auVar66);
              auVar41 = vunpckhpd_avx(auVar41,auVar66);
              auVar66 = vunpcklpd_avx(auVar68,auVar46);
              auVar68 = vunpckhpd_avx(auVar68,auVar46);
              auVar46._16_16_ = auVar41._0_16_;
              auVar46._0_16_ = auVar64._0_16_;
              auVar58._16_16_ = auVar68._0_16_;
              auVar58._0_16_ = auVar66._0_16_;
              auVar41 = vperm2f128_avx(auVar64,auVar41,0x31);
              auVar68 = vperm2f128_avx(auVar66,auVar68,0x31);
              *(undefined1 (*) [32])ppp_Var21 = auVar46;
              *(undefined1 (*) [32])(ppp_Var21 + 4) = auVar58;
              *(undefined1 (*) [32])(ppp_Var21 + 8) = auVar41;
              *(undefined1 (*) [32])(ppp_Var21 + 0xc) = auVar68;
              ppp_Var21 = ppp_Var21 + 0x10;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + (long)(int)(uVar3 * 8) * 4);
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar24);
      }
      uVar23 = uVar23 + 1;
      lVar20 = lVar20 + 0x80;
    } while (uVar23 != uVar22);
  }
  iVar33 = (uVar16 & 0xfffffffc) + iVar33;
  if (iVar33 < (int)uVar3) {
    lVar20 = (long)iVar33;
    lVar18 = lVar20 << 5;
    do {
      if (0 < (int)_h) {
        uVar16 = (uint)lVar20;
        uVar30 = uVar16 + 7;
        uVar22 = uVar16 + 3;
        if (-1 < (int)uVar16) {
          uVar30 = uVar16;
          uVar22 = uVar16;
        }
        iVar36 = uVar16 - (uVar30 & 0xfffffff8);
        iVar33 = (uVar16 - (uVar30 & 0xfffffff8)) + 3;
        if (-1 < iVar36) {
          iVar33 = iVar36;
        }
        ppp_Var21 = (_func_int ***)
                    ((long)(_func_int ***)local_c8.data +
                    (long)(int)((iVar33 >> 2) +
                               ((int)uVar30 >> 3) + (uVar16 - (uVar22 & 0xfffffffc))) *
                    local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                    );
        uVar23 = 0;
        do {
          if (0 < iVar4) {
            pauVar31 = (undefined1 (*) [32])
                       ((long)bottom_im2col->data +
                       bottom_im2col->cstep * bottom_im2col->elemsize * uVar23 + lVar18);
            iVar33 = iVar4;
            do {
              *(undefined1 (*) [32])ppp_Var21 = *pauVar31;
              ppp_Var21 = ppp_Var21 + 4;
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + (long)(int)(uVar3 * 8) * 4);
              iVar33 = iVar33 + -1;
            } while (iVar33 != 0);
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar24);
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar20 < lVar19);
  }
  uVar16 = (int)local_80 >> 1;
  if (0 < (int)uVar16) {
    iVar33 = _h * iVar4 * 8;
    local_74 = _h * iVar4 * 8;
    local_78 = _h * iVar4 * 8;
    local_60 = (ulong)uVar16;
    uVar24 = 0;
    do {
      pauVar32 = (undefined1 (*) [32])
                 (uVar24 * 2 * local_68->cstep * local_68->elemsize + (long)local_68->data);
      pauVar34 = (undefined1 (*) [32])
                 ((uVar24 * 2 + 1) * local_68->cstep * local_68->elemsize + (long)local_68->data);
      pauVar31 = (undefined1 (*) [32])(uVar24 * 0x20 + (long)local_70);
      if (local_70 == (void *)0x0) {
        pauVar31 = (undefined1 (*) [32])&local_58;
      }
      local_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      if ((int)uVar3 < 8) {
        uVar23 = 0;
      }
      else {
        lVar20 = 0;
        uVar28 = 0;
        do {
          auVar41 = *pauVar31;
          auVar68 = auVar41;
          auVar64 = auVar41;
          auVar66 = auVar41;
          auVar55 = auVar41;
          auVar59 = auVar41;
          auVar47 = auVar41;
          auVar51 = auVar41;
          if (0 < (int)(_h * iVar4 * 8)) {
            lVar18 = local_c8.cstep *
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * lVar20;
            lVar29 = 0;
            iVar36 = iVar33;
            auVar46 = auVar41;
            auVar58 = auVar41;
            auVar63 = auVar41;
            auVar69 = auVar41;
            auVar74 = auVar41;
            auVar75 = auVar41;
            auVar70 = auVar41;
            auVar71 = auVar41;
            do {
              pfVar17 = (float *)((long)kernel->data +
                                 lVar29 + kernel->cstep * uVar24 * kernel->elemsize);
              fVar5 = *pfVar17;
              fVar6 = pfVar17[1];
              fVar7 = pfVar17[2];
              fVar8 = pfVar17[3];
              fVar9 = pfVar17[4];
              fVar10 = pfVar17[5];
              fVar11 = pfVar17[6];
              fVar1 = *(float *)((long)(_func_int ***)local_c8.data + lVar29 + lVar18);
              fVar2 = *(float *)((long)(_func_int ***)local_c8.data + lVar29 + lVar18 + 4);
              auVar41._0_4_ = fVar1 * fVar5 + auVar46._0_4_;
              auVar41._4_4_ = fVar1 * fVar6 + auVar46._4_4_;
              auVar41._8_4_ = fVar1 * fVar7 + auVar46._8_4_;
              auVar41._12_4_ = fVar1 * fVar8 + auVar46._12_4_;
              auVar41._16_4_ = fVar1 * fVar9 + auVar46._16_4_;
              auVar41._20_4_ = fVar1 * fVar10 + auVar46._20_4_;
              auVar41._24_4_ = fVar1 * fVar11 + auVar46._24_4_;
              auVar41._28_4_ = fVar1 + auVar46._28_4_;
              auVar68._0_4_ = fVar2 * fVar5 + auVar71._0_4_;
              auVar68._4_4_ = fVar2 * fVar6 + auVar71._4_4_;
              auVar68._8_4_ = fVar2 * fVar7 + auVar71._8_4_;
              auVar68._12_4_ = fVar2 * fVar8 + auVar71._12_4_;
              auVar68._16_4_ = fVar2 * fVar9 + auVar71._16_4_;
              auVar68._20_4_ = fVar2 * fVar10 + auVar71._20_4_;
              auVar68._24_4_ = fVar2 * fVar11 + auVar71._24_4_;
              auVar68._28_4_ = fVar1 + auVar71._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_c8.data + 8))->_vptr_Allocator +
                                lVar29 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_c8.data + 8))->_vptr_Allocator +
                                lVar29 + lVar18 + 4);
              auVar64._0_4_ = fVar1 * fVar5 + auVar75._0_4_;
              auVar64._4_4_ = fVar1 * fVar6 + auVar75._4_4_;
              auVar64._8_4_ = fVar1 * fVar7 + auVar75._8_4_;
              auVar64._12_4_ = fVar1 * fVar8 + auVar75._12_4_;
              auVar64._16_4_ = fVar1 * fVar9 + auVar75._16_4_;
              auVar64._20_4_ = fVar1 * fVar10 + auVar75._20_4_;
              auVar64._24_4_ = fVar1 * fVar11 + auVar75._24_4_;
              auVar64._28_4_ = fVar1 + auVar75._28_4_;
              auVar66._0_4_ = fVar2 * fVar5 + auVar70._0_4_;
              auVar66._4_4_ = fVar2 * fVar6 + auVar70._4_4_;
              auVar66._8_4_ = fVar2 * fVar7 + auVar70._8_4_;
              auVar66._12_4_ = fVar2 * fVar8 + auVar70._12_4_;
              auVar66._16_4_ = fVar2 * fVar9 + auVar70._16_4_;
              auVar66._20_4_ = fVar2 * fVar10 + auVar70._20_4_;
              auVar66._24_4_ = fVar2 * fVar11 + auVar70._24_4_;
              auVar66._28_4_ = fVar1 + auVar70._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_c8.data + 0x10))->_vptr_Allocator
                                + lVar29 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_c8.data + 0x10))->_vptr_Allocator
                                + lVar29 + lVar18 + 4);
              auVar55._0_4_ = fVar1 * fVar5 + auVar69._0_4_;
              auVar55._4_4_ = fVar1 * fVar6 + auVar69._4_4_;
              auVar55._8_4_ = fVar1 * fVar7 + auVar69._8_4_;
              auVar55._12_4_ = fVar1 * fVar8 + auVar69._12_4_;
              auVar55._16_4_ = fVar1 * fVar9 + auVar69._16_4_;
              auVar55._20_4_ = fVar1 * fVar10 + auVar69._20_4_;
              auVar55._24_4_ = fVar1 * fVar11 + auVar69._24_4_;
              auVar55._28_4_ = fVar1 + auVar69._28_4_;
              auVar59._0_4_ = fVar2 * fVar5 + auVar74._0_4_;
              auVar59._4_4_ = fVar2 * fVar6 + auVar74._4_4_;
              auVar59._8_4_ = fVar2 * fVar7 + auVar74._8_4_;
              auVar59._12_4_ = fVar2 * fVar8 + auVar74._12_4_;
              auVar59._16_4_ = fVar2 * fVar9 + auVar74._16_4_;
              auVar59._20_4_ = fVar2 * fVar10 + auVar74._20_4_;
              auVar59._24_4_ = fVar2 * fVar11 + auVar74._24_4_;
              auVar59._28_4_ = fVar1 + auVar74._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_c8.data + 0x18))->_vptr_Allocator
                                + lVar29 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_c8.data + 0x18))->_vptr_Allocator
                                + lVar29 + lVar18 + 4);
              auVar47._0_4_ = fVar1 * fVar5 + auVar58._0_4_;
              auVar47._4_4_ = fVar1 * fVar6 + auVar58._4_4_;
              auVar47._8_4_ = fVar1 * fVar7 + auVar58._8_4_;
              auVar47._12_4_ = fVar1 * fVar8 + auVar58._12_4_;
              auVar47._16_4_ = fVar1 * fVar9 + auVar58._16_4_;
              auVar47._20_4_ = fVar1 * fVar10 + auVar58._20_4_;
              auVar47._24_4_ = fVar1 * fVar11 + auVar58._24_4_;
              auVar47._28_4_ = fVar1 + auVar58._28_4_;
              auVar51._0_4_ = fVar2 * fVar5 + auVar63._0_4_;
              auVar51._4_4_ = fVar2 * fVar6 + auVar63._4_4_;
              auVar51._8_4_ = fVar2 * fVar7 + auVar63._8_4_;
              auVar51._12_4_ = fVar2 * fVar8 + auVar63._12_4_;
              auVar51._16_4_ = fVar2 * fVar9 + auVar63._16_4_;
              auVar51._20_4_ = fVar2 * fVar10 + auVar63._20_4_;
              auVar51._24_4_ = fVar2 * fVar11 + auVar63._24_4_;
              auVar51._28_4_ = pfVar17[7] + auVar63._28_4_;
              lVar29 = lVar29 + 0x20;
              iVar36 = iVar36 + -1;
              auVar46 = auVar41;
              auVar58 = auVar47;
              auVar63 = auVar51;
              auVar69 = auVar55;
              auVar74 = auVar59;
              auVar75 = auVar64;
              auVar70 = auVar66;
              auVar71 = auVar68;
            } while (iVar36 != 0);
          }
          auVar70._16_16_ = auVar68._0_16_;
          auVar70._0_16_ = auVar41._0_16_;
          *pauVar32 = auVar70;
          auVar71._16_16_ = auVar66._0_16_;
          auVar71._0_16_ = auVar64._0_16_;
          pauVar32[1] = auVar71;
          auVar72._16_16_ = auVar59._0_16_;
          auVar72._0_16_ = auVar55._0_16_;
          pauVar32[2] = auVar72;
          auVar73._16_16_ = auVar51._0_16_;
          auVar73._0_16_ = auVar47._0_16_;
          pauVar32[3] = auVar73;
          auVar41 = vperm2f128_avx(auVar41,auVar68,0x31);
          *pauVar34 = auVar41;
          auVar41 = vperm2f128_avx(auVar64,auVar66,0x31);
          pauVar34[1] = auVar41;
          auVar41 = vperm2f128_avx(auVar55,auVar59,0x31);
          pauVar34[2] = auVar41;
          auVar41 = vperm2f128_avx(auVar47,auVar51,0x31);
          pauVar34[3] = auVar41;
          pauVar32 = pauVar32 + 4;
          pauVar34 = pauVar34 + 4;
          uVar23 = uVar28 + 8;
          lVar18 = uVar28 + 0xf;
          lVar20 = lVar20 + 1;
          uVar28 = uVar23;
        } while (lVar18 < lVar19);
      }
      if ((int)((uint)uVar23 | 3) < (int)uVar3) {
        uVar16 = 0;
        do {
          auVar52 = *pauVar31;
          iVar36 = (int)uVar23;
          auVar42 = auVar52;
          auVar56 = auVar52;
          auVar48 = auVar52;
          if (0 < local_74) {
            lVar20 = local_c8.cstep *
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                     (ulong)((uVar16 & 1) + ((uint)(uVar23 >> 3) & 0x1fffffff));
            lVar18 = 0;
            iVar37 = iVar33;
            auVar41 = auVar52;
            auVar68 = auVar52;
            auVar46 = auVar52;
            auVar64 = auVar52;
            do {
              pfVar17 = (float *)((long)kernel->data +
                                 lVar18 * 2 + kernel->cstep * uVar24 * kernel->elemsize);
              fVar5 = *pfVar17;
              fVar6 = pfVar17[1];
              fVar7 = pfVar17[2];
              fVar8 = pfVar17[3];
              fVar9 = pfVar17[4];
              fVar10 = pfVar17[5];
              fVar11 = pfVar17[6];
              fVar1 = *(float *)((long)(_func_int ***)local_c8.data + lVar18 + lVar20);
              fVar2 = *(float *)((long)(_func_int ***)local_c8.data + lVar18 + lVar20 + 4);
              auVar56._0_4_ = fVar1 * fVar5 + auVar64._0_4_;
              auVar56._4_4_ = fVar1 * fVar6 + auVar64._4_4_;
              auVar56._8_4_ = fVar1 * fVar7 + auVar64._8_4_;
              auVar56._12_4_ = fVar1 * fVar8 + auVar64._12_4_;
              auVar56._16_4_ = fVar1 * fVar9 + auVar64._16_4_;
              auVar56._20_4_ = fVar1 * fVar10 + auVar64._20_4_;
              auVar56._24_4_ = fVar1 * fVar11 + auVar64._24_4_;
              auVar56._28_4_ = fVar1 + auVar64._28_4_;
              auVar52._0_4_ = fVar2 * fVar5 + auVar68._0_4_;
              auVar52._4_4_ = fVar2 * fVar6 + auVar68._4_4_;
              auVar52._8_4_ = fVar2 * fVar7 + auVar68._8_4_;
              auVar52._12_4_ = fVar2 * fVar8 + auVar68._12_4_;
              auVar52._16_4_ = fVar2 * fVar9 + auVar68._16_4_;
              auVar52._20_4_ = fVar2 * fVar10 + auVar68._20_4_;
              auVar52._24_4_ = fVar2 * fVar11 + auVar68._24_4_;
              auVar52._28_4_ = fVar1 + auVar68._28_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_c8.data + 8))->_vptr_Allocator +
                                lVar18 + lVar20);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_c8.data + 8))->_vptr_Allocator +
                                lVar18 + lVar20 + 4);
              auVar48._0_4_ = fVar1 * fVar5 + auVar46._0_4_;
              auVar48._4_4_ = fVar1 * fVar6 + auVar46._4_4_;
              auVar48._8_4_ = fVar1 * fVar7 + auVar46._8_4_;
              auVar48._12_4_ = fVar1 * fVar8 + auVar46._12_4_;
              auVar48._16_4_ = fVar1 * fVar9 + auVar46._16_4_;
              auVar48._20_4_ = fVar1 * fVar10 + auVar46._20_4_;
              auVar48._24_4_ = fVar1 * fVar11 + auVar46._24_4_;
              auVar48._28_4_ = fVar1 + auVar46._28_4_;
              auVar42._0_4_ = fVar2 * fVar5 + auVar41._0_4_;
              auVar42._4_4_ = fVar2 * fVar6 + auVar41._4_4_;
              auVar42._8_4_ = fVar2 * fVar7 + auVar41._8_4_;
              auVar42._12_4_ = fVar2 * fVar8 + auVar41._12_4_;
              auVar42._16_4_ = fVar2 * fVar9 + auVar41._16_4_;
              auVar42._20_4_ = fVar2 * fVar10 + auVar41._20_4_;
              auVar42._24_4_ = fVar2 * fVar11 + auVar41._24_4_;
              auVar42._28_4_ = pfVar17[7] + auVar41._28_4_;
              lVar18 = lVar18 + 0x10;
              iVar37 = iVar37 + -1;
              auVar41 = auVar42;
              auVar68 = auVar52;
              auVar46 = auVar48;
              auVar64 = auVar56;
            } while (iVar37 != 0);
          }
          auVar60._16_16_ = auVar52._0_16_;
          auVar60._0_16_ = auVar56._0_16_;
          *pauVar32 = auVar60;
          auVar61._16_16_ = auVar42._0_16_;
          auVar61._0_16_ = auVar48._0_16_;
          pauVar32[1] = auVar61;
          auVar41 = vperm2f128_avx(auVar56,auVar52,0x31);
          *pauVar34 = auVar41;
          auVar41 = vperm2f128_avx(auVar48,auVar42,0x31);
          pauVar34[1] = auVar41;
          pauVar32 = pauVar32 + 2;
          pauVar34 = pauVar34 + 2;
          uVar23 = (ulong)(iVar36 + 4);
          uVar16 = (uint)(byte)((char)uVar16 + 1);
        } while (iVar36 + 7 < (int)uVar3);
      }
      else {
        uVar23 = uVar23 & 0xffffffff;
      }
      if ((int)uVar23 < (int)uVar3) {
        do {
          uVar16 = (uint)uVar23;
          auVar43 = *pauVar31;
          if (0 < local_78) {
            pfVar17 = (float *)(kernel->cstep * uVar24 * kernel->elemsize + (long)kernel->data);
            lVar20 = 0;
            auVar41 = auVar43;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_c8.data +
                                lVar20 * 4 +
                                local_c8.cstep *
                                CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                                (ulong)((uVar16 & 3) + (int)(uVar23 >> 3) +
                                       (uint)((uVar16 >> 2 & 1) != 0)));
              auVar43._0_4_ = fVar1 * *pfVar17 + auVar41._0_4_;
              auVar43._4_4_ = fVar1 * pfVar17[1] + auVar41._4_4_;
              auVar43._8_4_ = fVar1 * pfVar17[2] + auVar41._8_4_;
              auVar43._12_4_ = fVar1 * pfVar17[3] + auVar41._12_4_;
              auVar43._16_4_ = fVar1 * pfVar17[4] + auVar41._16_4_;
              auVar43._20_4_ = fVar1 * pfVar17[5] + auVar41._20_4_;
              auVar43._24_4_ = fVar1 * pfVar17[6] + auVar41._24_4_;
              auVar43._28_4_ = fVar1 + auVar41._28_4_;
              pfVar17 = pfVar17 + 8;
              lVar20 = lVar20 + 1;
              auVar41 = auVar43;
            } while (iVar33 != (int)lVar20);
          }
          *(undefined1 (*) [16])*pauVar32 = auVar43._0_16_;
          *(undefined1 (*) [16])*pauVar34 = auVar43._16_16_;
          pauVar32 = (undefined1 (*) [32])((long)*pauVar32 + 0x10);
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
          uVar23 = (ulong)(uVar16 + 1);
        } while (uVar16 + 1 != uVar3);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != local_60);
  }
  uVar24 = local_80 & 0xfffffffffffffffe;
  if ((int)uVar24 != (int)local_80) {
    iVar33 = _h * iVar4 * 8;
    do {
      pauVar25 = (undefined1 (*) [16])
                 (local_68->cstep * uVar24 * local_68->elemsize + (long)local_68->data);
      pauVar26 = (undefined1 (*) [16])(uVar24 * 0x10 + (long)local_70);
      if (local_70 == (void *)0x0) {
        pauVar26 = (undefined1 (*) [16])&local_58;
      }
      local_58 = 0;
      uStack_50 = 0;
      iVar36 = (int)uVar24;
      if ((int)uVar3 < 8) {
        uVar23 = 0;
      }
      else {
        uVar16 = ((uint)(uVar24 >> 0x1f) & 1) + iVar36;
        lVar20 = 0;
        uVar28 = 0;
        do {
          auVar67 = *pauVar26;
          auVar65 = auVar67;
          auVar62 = auVar67;
          auVar57 = auVar67;
          auVar53 = auVar67;
          auVar49 = auVar67;
          auVar44 = auVar67;
          auVar38 = auVar67;
          if (0 < (int)(_h * iVar4 * 8)) {
            lVar18 = local_c8.cstep *
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * lVar20;
            lVar29 = 0;
            iVar37 = iVar33;
            auVar54 = auVar67;
            auVar50 = auVar67;
            auVar45 = auVar67;
            auVar39 = auVar67;
            auVar40 = auVar67;
            auVar13 = auVar67;
            auVar14 = auVar67;
            auVar15 = auVar67;
            do {
              pfVar17 = (float *)((long)kernel->data +
                                 lVar29 + kernel->cstep *
                                          (long)(int)(((int)uVar16 >> 1) +
                                                     (iVar36 - (uVar16 & 0xfffffffe))) *
                                          kernel->elemsize);
              fVar5 = *pfVar17;
              fVar6 = pfVar17[1];
              fVar7 = pfVar17[2];
              fVar8 = pfVar17[3];
              fVar1 = *(float *)((long)(_func_int ***)local_c8.data + lVar29 * 2 + lVar18);
              fVar2 = *(float *)((long)(_func_int ***)local_c8.data + lVar29 * 2 + lVar18 + 4);
              auVar67._0_4_ = fVar1 * fVar5 + auVar15._0_4_;
              auVar67._4_4_ = fVar1 * fVar6 + auVar15._4_4_;
              auVar67._8_4_ = fVar1 * fVar7 + auVar15._8_4_;
              auVar67._12_4_ = fVar1 * fVar8 + auVar15._12_4_;
              auVar65._0_4_ = fVar2 * fVar5 + auVar14._0_4_;
              auVar65._4_4_ = fVar2 * fVar6 + auVar14._4_4_;
              auVar65._8_4_ = fVar2 * fVar7 + auVar14._8_4_;
              auVar65._12_4_ = fVar2 * fVar8 + auVar14._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_c8.data + 8))->_vptr_Allocator +
                                lVar29 * 2 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_c8.data + 8))->_vptr_Allocator +
                                lVar29 * 2 + lVar18 + 4);
              auVar62._0_4_ = fVar1 * fVar5 + auVar13._0_4_;
              auVar62._4_4_ = fVar1 * fVar6 + auVar13._4_4_;
              auVar62._8_4_ = fVar1 * fVar7 + auVar13._8_4_;
              auVar62._12_4_ = fVar1 * fVar8 + auVar13._12_4_;
              auVar57._0_4_ = fVar2 * fVar5 + auVar40._0_4_;
              auVar57._4_4_ = fVar2 * fVar6 + auVar40._4_4_;
              auVar57._8_4_ = fVar2 * fVar7 + auVar40._8_4_;
              auVar57._12_4_ = fVar2 * fVar8 + auVar40._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_c8.data + 0x10))->_vptr_Allocator
                                + lVar29 * 2 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_c8.data + 0x10))->_vptr_Allocator
                                + lVar29 * 2 + lVar18 + 4);
              auVar53._0_4_ = fVar1 * fVar5 + auVar39._0_4_;
              auVar53._4_4_ = fVar1 * fVar6 + auVar39._4_4_;
              auVar53._8_4_ = fVar1 * fVar7 + auVar39._8_4_;
              auVar53._12_4_ = fVar1 * fVar8 + auVar39._12_4_;
              auVar49._0_4_ = fVar2 * fVar5 + auVar45._0_4_;
              auVar49._4_4_ = fVar2 * fVar6 + auVar45._4_4_;
              auVar49._8_4_ = fVar2 * fVar7 + auVar45._8_4_;
              auVar49._12_4_ = fVar2 * fVar8 + auVar45._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_c8.data + 0x18))->_vptr_Allocator
                                + lVar29 * 2 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_c8.data + 0x18))->_vptr_Allocator
                                + lVar29 * 2 + lVar18 + 4);
              auVar44._0_4_ = fVar1 * fVar5 + auVar50._0_4_;
              auVar44._4_4_ = fVar1 * fVar6 + auVar50._4_4_;
              auVar44._8_4_ = fVar1 * fVar7 + auVar50._8_4_;
              auVar44._12_4_ = fVar1 * fVar8 + auVar50._12_4_;
              auVar38._0_4_ = fVar2 * fVar5 + auVar54._0_4_;
              auVar38._4_4_ = fVar2 * fVar6 + auVar54._4_4_;
              auVar38._8_4_ = fVar2 * fVar7 + auVar54._8_4_;
              auVar38._12_4_ = fVar2 * fVar8 + auVar54._12_4_;
              lVar29 = lVar29 + 0x10;
              iVar37 = iVar37 + -1;
              auVar54 = auVar38;
              auVar50 = auVar44;
              auVar45 = auVar49;
              auVar39 = auVar53;
              auVar40 = auVar57;
              auVar13 = auVar62;
              auVar14 = auVar65;
              auVar15 = auVar67;
            } while (iVar37 != 0);
          }
          *pauVar25 = auVar67;
          pauVar25[1] = auVar65;
          pauVar25[2] = auVar62;
          pauVar25[3] = auVar57;
          pauVar25[4] = auVar53;
          pauVar25[5] = auVar49;
          pauVar25[6] = auVar44;
          pauVar25[7] = auVar38;
          pauVar25 = pauVar25 + 8;
          uVar23 = uVar28 + 8;
          lVar18 = uVar28 + 0xf;
          lVar20 = lVar20 + 1;
          uVar28 = uVar23;
        } while (lVar18 < lVar19);
      }
      if ((int)((uint)uVar23 | 3) < (int)uVar3) {
        uVar16 = ((uint)(uVar24 >> 0x1f) & 1) + iVar36;
        uVar22 = 0;
        do {
          auVar54 = *pauVar26;
          iVar37 = (int)uVar23;
          auVar50 = auVar54;
          auVar45 = auVar54;
          auVar39 = auVar54;
          if (0 < (int)(_h * iVar4 * 8)) {
            lVar18 = local_c8.cstep *
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                     (ulong)((uVar22 & 1) + ((uint)(uVar23 >> 3) & 0x1fffffff));
            lVar20 = 0;
            iVar35 = iVar33;
            auVar67 = auVar54;
            auVar65 = auVar54;
            auVar62 = auVar54;
            auVar57 = auVar54;
            do {
              pfVar17 = (float *)((long)kernel->data +
                                 lVar20 + kernel->cstep *
                                          (long)(int)(((int)uVar16 >> 1) +
                                                     (iVar36 - (uVar16 & 0xfffffffe))) *
                                          kernel->elemsize);
              fVar5 = *pfVar17;
              fVar6 = pfVar17[1];
              fVar7 = pfVar17[2];
              fVar8 = pfVar17[3];
              fVar1 = *(float *)((long)(_func_int ***)local_c8.data + lVar20 + lVar18);
              fVar2 = *(float *)((long)(_func_int ***)local_c8.data + lVar20 + lVar18 + 4);
              auVar54._0_4_ = fVar1 * fVar5 + auVar57._0_4_;
              auVar54._4_4_ = fVar1 * fVar6 + auVar57._4_4_;
              auVar54._8_4_ = fVar1 * fVar7 + auVar57._8_4_;
              auVar54._12_4_ = fVar1 * fVar8 + auVar57._12_4_;
              auVar50._0_4_ = fVar2 * fVar5 + auVar62._0_4_;
              auVar50._4_4_ = fVar2 * fVar6 + auVar62._4_4_;
              auVar50._8_4_ = fVar2 * fVar7 + auVar62._8_4_;
              auVar50._12_4_ = fVar2 * fVar8 + auVar62._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)((long)local_c8.data + 8))->_vptr_Allocator +
                                lVar20 + lVar18);
              fVar2 = *(float *)((long)&((Allocator *)((long)local_c8.data + 8))->_vptr_Allocator +
                                lVar20 + lVar18 + 4);
              auVar45._0_4_ = fVar1 * fVar5 + auVar65._0_4_;
              auVar45._4_4_ = fVar1 * fVar6 + auVar65._4_4_;
              auVar45._8_4_ = fVar1 * fVar7 + auVar65._8_4_;
              auVar45._12_4_ = fVar1 * fVar8 + auVar65._12_4_;
              auVar39._0_4_ = fVar2 * fVar5 + auVar67._0_4_;
              auVar39._4_4_ = fVar2 * fVar6 + auVar67._4_4_;
              auVar39._8_4_ = fVar2 * fVar7 + auVar67._8_4_;
              auVar39._12_4_ = fVar2 * fVar8 + auVar67._12_4_;
              lVar20 = lVar20 + 0x10;
              iVar35 = iVar35 + -1;
              auVar67 = auVar39;
              auVar65 = auVar45;
              auVar62 = auVar50;
              auVar57 = auVar54;
            } while (iVar35 != 0);
          }
          *pauVar25 = auVar54;
          pauVar25[1] = auVar50;
          pauVar25[2] = auVar45;
          pauVar25[3] = auVar39;
          pauVar25 = pauVar25 + 4;
          uVar23 = (ulong)(iVar37 + 4);
          uVar22 = (uint)(byte)((char)uVar22 + 1);
        } while (iVar37 + 7 < (int)uVar3);
      }
      else {
        uVar23 = uVar23 & 0xffffffff;
      }
      if ((int)uVar23 < (int)uVar3) {
        uVar16 = ((uint)(uVar24 >> 0x1f) & 1) + iVar36;
        do {
          uVar22 = (uint)uVar23;
          auVar40 = *pauVar26;
          if (0 < (int)(_h * iVar4 * 8)) {
            pfVar17 = (float *)(kernel->cstep *
                                (long)(int)(((int)uVar16 >> 1) + (iVar36 - (uVar16 & 0xfffffffe))) *
                                kernel->elemsize + (long)kernel->data);
            lVar20 = 0;
            auVar67 = auVar40;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_c8.data +
                                lVar20 * 4 +
                                local_c8.cstep *
                                CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                                (ulong)((uVar22 & 3) + (int)(uVar23 >> 3) +
                                       (uint)((uVar22 >> 2 & 1) != 0)));
              auVar40._0_4_ = fVar1 * *pfVar17 + auVar67._0_4_;
              auVar40._4_4_ = fVar1 * pfVar17[1] + auVar67._4_4_;
              auVar40._8_4_ = fVar1 * pfVar17[2] + auVar67._8_4_;
              auVar40._12_4_ = fVar1 * pfVar17[3] + auVar67._12_4_;
              pfVar17 = pfVar17 + 4;
              lVar20 = lVar20 + 1;
              auVar67 = auVar40;
            } while (iVar33 != (int)lVar20);
          }
          *pauVar25 = auVar40;
          pauVar25 = pauVar25 + 1;
          uVar23 = (ulong)(uVar22 + 1);
        } while (uVar22 + 1 != uVar3);
      }
      uVar24 = uVar24 + 1;
    } while ((long)uVar24 < (long)local_80);
  }
  piVar12 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 32u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 32u, 8, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 32u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 32u, 8, opt.workspace_allocator);
    {
        int nn_size = size / 8;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                    __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                    __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                    __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                    __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                    _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                    _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                    _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                    _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                    _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x4
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);

                    __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                    __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                    __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                    __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                    __m256 _tmp4 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp5 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                    __m256 _tmp6 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                    __m256 _tmp7 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                    _r0 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                    _r1 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                    _r2 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                    _r3 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);

                    img0 += size * 8;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        float* outptr0 = top_blob.channel(p);
        float* outptr1 = top_blob.channel(p + 1);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum0, 0));
            _mm_store_ps(outptr0 + 4, _mm256_extractf128_ps(_sum1, 0));
            _mm_store_ps(outptr0 + 8, _mm256_extractf128_ps(_sum2, 0));
            _mm_store_ps(outptr0 + 12, _mm256_extractf128_ps(_sum3, 0));
            _mm_store_ps(outptr0 + 16, _mm256_extractf128_ps(_sum4, 0));
            _mm_store_ps(outptr0 + 20, _mm256_extractf128_ps(_sum5, 0));
            _mm_store_ps(outptr0 + 24, _mm256_extractf128_ps(_sum6, 0));
            _mm_store_ps(outptr0 + 28, _mm256_extractf128_ps(_sum7, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum0, 1));
            _mm_store_ps(outptr1 + 4, _mm256_extractf128_ps(_sum1, 1));
            _mm_store_ps(outptr1 + 8, _mm256_extractf128_ps(_sum2, 1));
            _mm_store_ps(outptr1 + 12, _mm256_extractf128_ps(_sum3, 1));
            _mm_store_ps(outptr1 + 16, _mm256_extractf128_ps(_sum4, 1));
            _mm_store_ps(outptr1 + 20, _mm256_extractf128_ps(_sum5, 1));
            _mm_store_ps(outptr1 + 24, _mm256_extractf128_ps(_sum6, 1));
            _mm_store_ps(outptr1 + 28, _mm256_extractf128_ps(_sum7, 1));

            outptr0 += 32;
            outptr1 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum0, 0));
            _mm_store_ps(outptr0 + 4, _mm256_extractf128_ps(_sum1, 0));
            _mm_store_ps(outptr0 + 8, _mm256_extractf128_ps(_sum2, 0));
            _mm_store_ps(outptr0 + 12, _mm256_extractf128_ps(_sum3, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum0, 1));
            _mm_store_ps(outptr1 + 4, _mm256_extractf128_ps(_sum1, 1));
            _mm_store_ps(outptr1 + 8, _mm256_extractf128_ps(_sum2, 1));
            _mm_store_ps(outptr1 + 12, _mm256_extractf128_ps(_sum3, 1));

            outptr0 += 16;
            outptr1 += 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m256 _sum = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 8;
            }

            _mm_store_ps(outptr0, _mm256_extractf128_ps(_sum, 0));
            _mm_store_ps(outptr1, _mm256_extractf128_ps(_sum, 1));

            outptr0 += 4;
            outptr1 += 4;
        }
    }

    remain_outch_start += nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            _mm_store_ps(outptr0 + 16, _sum4);
            _mm_store_ps(outptr0 + 20, _sum5);
            _mm_store_ps(outptr0 + 24, _sum6);
            _mm_store_ps(outptr0 + 28, _sum7);

            outptr0 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);

            outptr0 += 16;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr = kernel.channel(p / 2 + p % 2);

            int nn = inch * maxk * 8; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr);
                __m128 _val0 = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                tmpptr += 1;
                kptr += 4;
            }

            _mm_store_ps(outptr0, _sum);

            outptr0 += 4;
        }
    }
}